

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

double __thiscall Mat::Dot(Mat *this,Mat *rhs)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = this->n_cols_ * this->n_rows_;
  if (uVar2 != rhs->n_cols_ * rhs->n_rows_) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in Dot(Vector,Vector)"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(1);
  }
  if ((int)uVar2 < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar4 = dVar4 + this->v_[uVar3] * rhs->v_[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return dVar4;
}

Assistant:

double Mat::Dot(const Mat &rhs)
{
	if ((*this).Size()!=rhs.Size()) {
		cerr << "ERROR: Incompatible shape in Dot(Vector,Vector)" << endl;
		exit(1);
	};
	double Sum = 0.0;
	for (int i=0; i<(*this).Size(); i++) Sum+=(*this).v_[i]*rhs.v_[i];
	return Sum;
}